

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_encoder_test.cc
# Opt level: O3

void __thiscall
prometheus::anon_unknown_0::LabelEncoderTest_regular_Test::TestBody
          (LabelEncoderTest_regular_Test *this)

{
  Label *label;
  char *message;
  internal local_78 [8];
  undefined8 *local_70;
  string local_68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  
  ::std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[4],_true>
            (&local_48,(char (*) [4])"foo",(char (*) [4])0x13a0ec);
  LabelEncoderTest::Encode(&local_68,(LabelEncoderTest *)&local_48,label);
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            (local_78,"\"/foo/bar\"","Encode(Label{\"foo\", \"bar\"})",(char (*) [9])"/foo/bar",
             &local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.second._M_dataplus._M_p != &local_48.second.field_2) {
    operator_delete(local_48.second._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.first._M_dataplus._M_p != &local_48.first.field_2) {
    operator_delete(local_48.first._M_dataplus._M_p);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_70 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_70;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/tests/internal/label_encoder_test.cc"
               ,0x17,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if ((long *)local_48.first._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48.first._M_dataplus._M_p + 8))();
    }
  }
  if (local_70 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_70 != local_70 + 2) {
      operator_delete((undefined8 *)*local_70);
    }
    operator_delete(local_70);
  }
  return;
}

Assistant:

TEST_F(LabelEncoderTest, regular) {
  EXPECT_EQ("/foo/bar", Encode(Label{"foo", "bar"}));
}